

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O2

EncodingState *
ZXing::Aztec::AddBinaryShiftChar
          (EncodingState *__return_storage_ptr__,EncodingState *state,int index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  EncodingState local_58;
  
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&tokens,&state->tokens);
  uVar2 = state->mode;
  iVar4 = state->bitCount;
  if (((ulong)uVar2 == 4) || (uVar2 == 2)) {
    uVar2 = *(uint *)(LATCH_TABLE + (ulong)uVar2 * 0x14);
    local_58.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = (uVar2 & 0xffff) - (uVar2 & 0xffff0000);
    std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
    emplace_back<ZXing::Aztec::Token>(&tokens,(Token *)&local_58);
    iVar4 = iVar4 + ((int)uVar2 >> 0x10);
    uVar2 = 0;
  }
  iVar1 = state->binaryShiftByteCount;
  uVar3 = 0x12;
  if ((iVar1 != 0) && (iVar1 != 0x1f)) {
    uVar3 = iVar1 == 0x3e | 8;
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,&tokens);
  __return_storage_ptr__->mode = uVar2;
  iVar1 = state->binaryShiftByteCount + 1;
  __return_storage_ptr__->binaryShiftByteCount = iVar1;
  __return_storage_ptr__->bitCount = uVar3 + iVar4;
  if (iVar1 == 0x81e) {
    EndBinaryShift(&local_58,__return_storage_ptr__,index + 1);
    EncodingState::operator=(__return_storage_ptr__,&local_58);
    std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
              ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)&local_58)
    ;
  }
  std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
            (&tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>);
  return __return_storage_ptr__;
}

Assistant:

static EncodingState AddBinaryShiftChar(const EncodingState& state, int index)
{
	auto tokens = state.tokens;
	int mode = state.mode;
	int bitCount = state.bitCount;
	if (state.mode == MODE_PUNCT || state.mode == MODE_DIGIT) {
		//assert binaryShiftByteCount == 0;
		int latch = LATCH_TABLE[mode][MODE_UPPER];
		tokens.push_back(Token::CreateSimple(latch & 0xFFFF, latch >> 16));
		bitCount += latch >> 16;
		mode = MODE_UPPER;
	}
	int deltaBitCount = (state.binaryShiftByteCount == 0 || state.binaryShiftByteCount == 31) ? 18 : (state.binaryShiftByteCount == 62) ? 9 : 8;
	EncodingState result{ tokens, mode, state.binaryShiftByteCount + 1, bitCount + deltaBitCount };
	if (result.binaryShiftByteCount == 2047 + 31) {
		// The string is as long as it's allowed to be.  We should end it.
		result = EndBinaryShift(result, index + 1);
	}
	return result;
}